

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O1

void __thiscall test::test_load_and_sign::test_method(test_load_and_sign *this)

{
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  string signature;
  string pk_str;
  long *local_100;
  shared_count sStack_e8;
  undefined1 **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  license::CryptoHelper::getInstance();
  loadPrivateKey_abi_cxx11_();
  (**(code **)(*local_100 + 0x20))(local_100,local_a0);
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"testString","");
  (**(code **)(*local_100 + 0x28))(local_c0,local_100,&local_e0);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x65);
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00542db8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = "signature is the right size";
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_48 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x66);
  std::__cxx11::string::compare((char *)local_c0);
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00542e78;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = "signature is repeatable";
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	const std::string signature = crypto->signString("testString");
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	BOOST_CHECK_MESSAGE(signature == SIGNATURE, "signature is repeatable");
	crypto.release();
}